

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.hpp
# Opt level: O0

void soplex::setDualStatus<double>(Desc *desc,SPxSolverBase<double> *base,SPxId *id)

{
  bool bVar1;
  int iVar2;
  Status SVar3;
  Status *pSVar4;
  SPxId *in_RDX;
  SPxSolverBase<double> *in_RSI;
  int n_1;
  int n;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  SPxLPBase<double> *in_stack_ffffffffffffffb0;
  SPxSolverBase<double> *this;
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  bVar1 = SPxId::isSPxRowId(in_RDX);
  if (bVar1) {
    SPxRowId::SPxRowId((SPxRowId *)&stack0xffffffffffffffdc,in_RDX);
    SPxLPBase<double>::number
              (in_stack_ffffffffffffffb0,
               (SPxRowId *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    SPxSolverBase<double>::basis(in_RSI);
    SVar3 = SPxBasisBase<double>::dualRowStatus
                      ((SPxBasisBase<double> *)
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       in_stack_ffffffffffffffd4);
    pSVar4 = SPxBasisBase<double>::Desc::rowStatus
                       ((Desc *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    *pSVar4 = SVar3;
  }
  else {
    this = in_RSI;
    SPxColId::SPxColId((SPxColId *)&stack0xffffffffffffffd0,in_RDX);
    iVar2 = SPxLPBase<double>::number
                      (&this->super_SPxLPBase<double>,
                       (SPxColId *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    SPxSolverBase<double>::basis(in_RSI);
    SVar3 = SPxBasisBase<double>::dualColStatus
                      ((SPxBasisBase<double> *)CONCAT44(in_stack_ffffffffffffffdc,iVar2),
                       in_stack_ffffffffffffffd4);
    pSVar4 = SPxBasisBase<double>::Desc::colStatus((Desc *)this,in_stack_ffffffffffffffac);
    *pSVar4 = SVar3;
  }
  return;
}

Assistant:

static void setDualStatus(
   typename SPxBasisBase<R>::Desc& desc,
   const SPxSolverBase<R>& base,
   const SPxId& id)
{
   if(id.isSPxRowId())
   {
      int n = base.number(SPxRowId(id));
      desc.rowStatus(n) = base.basis().dualRowStatus(n);
   }
   else
   {
      int n = base.number(SPxColId(id));
      desc.colStatus(n) = base.basis().dualColStatus(n);
   }
}